

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsMatrixUtils.cpp
# Opt level: O0

HighsStatus
assessMatrix(HighsLogOptions *log_options,string *matrix_name,HighsInt vec_dim,HighsInt num_vec,
            bool partitioned,vector<int,_std::allocator<int>_> *matrix_start,
            vector<int,_std::allocator<int>_> *matrix_p_end,
            vector<int,_std::allocator<int>_> *matrix_index,
            vector<double,_std::allocator<double>_> *matrix_value,double small_matrix_value,
            double large_matrix_value)

{
  value_type vVar1;
  int iVar2;
  int iVar3;
  bool bVar4;
  byte bVar5;
  HighsStatus HVar6;
  reference pvVar7;
  undefined8 uVar8;
  uint *puVar9;
  ValueType *pVVar10;
  reference pvVar11;
  uint in_ECX;
  int in_EDX;
  HighsLogOptions *in_RDI;
  byte in_R8B;
  vector<int,_std::allocator<int>_> *in_R9;
  char *in_XMM0_Qa;
  undefined4 in_XMM1_Da;
  undefined4 in_XMM1_Db;
  vector<int,_std::allocator<int>_> *in_stack_00000008;
  vector<int,_std::allocator<int>_> *in_stack_00000010;
  vector<double,_std::allocator<double>_> *in_stack_00000018;
  HighsStatus return_status;
  bool ok_value;
  bool large_value;
  double abs_value;
  bool legal_component;
  HighsInt component;
  HighsInt el;
  HighsInt to_el;
  HighsInt from_el;
  HighsInt ix_1;
  HighsHashTable<int,_void> index_set;
  double min_large_value;
  double max_large_value;
  HighsInt num_large_values;
  double min_small_value;
  double max_small_value;
  HighsInt num_small_values;
  HighsInt num_new_nz;
  bool this_p_end_too_big;
  bool this_start_too_big;
  bool this_p_end_too_small;
  bool this_start_too_small;
  HighsInt ix;
  HighsInt this_p_end;
  HighsInt this_start;
  HighsInt previous_start;
  HighsInt num_nz;
  bool warning_found;
  bool error_found;
  vector<double,_std::allocator<double>_> *pvVar12;
  undefined4 uVar13;
  int in_stack_fffffffffffffe70;
  undefined4 in_stack_fffffffffffffe74;
  undefined4 in_stack_fffffffffffffe80;
  undefined4 in_stack_fffffffffffffe84;
  KeyType_conflict *in_stack_fffffffffffffe90;
  HighsLogOptions *pHVar14;
  HighsHashTable<int,_void> *in_stack_fffffffffffffe98;
  vector<int,_std::allocator<int>_> *in_stack_fffffffffffffeb8;
  vector<int,_std::allocator<int>_> *in_stack_fffffffffffffec0;
  HighsHashTable<int,_void> *in_stack_fffffffffffffec8;
  bool in_stack_fffffffffffffed3;
  HighsInt in_stack_fffffffffffffed4;
  value_type vVar15;
  HighsLogOptions *in_stack_fffffffffffffed8;
  vector<double,_std::allocator<double>_> *in_stack_fffffffffffffef0;
  HighsStatus local_f0;
  uint local_c8;
  uint local_bc;
  HighsLogOptions *local_90;
  double local_88;
  uint local_7c;
  HighsLogOptions *local_78;
  double local_70;
  uint local_64;
  value_type local_60;
  uint local_58;
  uint local_54;
  uint local_50;
  uint local_4c;
  bool local_41;
  HighsStatus local_4;
  
  bVar5 = in_R8B & 1;
  pvVar12 = in_stack_00000018;
  HVar6 = assessMatrixDimensions
                    (in_stack_fffffffffffffed8,in_stack_fffffffffffffed4,in_stack_fffffffffffffed3,
                     (vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffec8,
                     in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8,in_stack_fffffffffffffef0);
  if (HVar6 == kError) {
    local_4 = kError;
  }
  else {
    bVar4 = false;
    pvVar7 = std::vector<int,_std::allocator<int>_>::operator[](in_R9,(long)(int)in_ECX);
    iVar2 = *pvVar7;
    pvVar7 = std::vector<int,_std::allocator<int>_>::operator[](in_R9,0);
    if (*pvVar7 == 0) {
      puVar9 = (uint *)std::vector<int,_std::allocator<int>_>::operator[](in_R9,0);
      local_4c = *puVar9;
      puVar9 = (uint *)std::vector<int,_std::allocator<int>_>::operator[](in_R9,0);
      local_50 = *puVar9;
      local_54 = 0;
      if (bVar5 != 0) {
        puVar9 = (uint *)std::vector<int,_std::allocator<int>_>::operator[](in_stack_00000008,0);
        local_54 = *puVar9;
      }
      for (local_58 = 0; uVar13 = (undefined4)((ulong)pvVar12 >> 0x20), (int)local_58 < (int)in_ECX;
          local_58 = local_58 + 1) {
        puVar9 = (uint *)std::vector<int,_std::allocator<int>_>::operator[]
                                   (in_R9,(long)(int)local_58);
        uVar13 = (undefined4)((ulong)pvVar12 >> 0x20);
        local_50 = *puVar9;
        if ((int)local_50 < (int)local_4c) {
          uVar8 = std::__cxx11::string::c_str();
          highsLogUser(in_RDI,kError,
                       "%s matrix packed vector %d has illegal start of %d < %d = previous start\n",
                       uVar8,(ulong)local_58,(ulong)local_50,CONCAT44(uVar13,local_4c));
          return kError;
        }
        if (bVar5 != 0) {
          puVar9 = (uint *)std::vector<int,_std::allocator<int>_>::operator[]
                                     (in_stack_00000008,(long)(int)local_58);
          uVar13 = (undefined4)((ulong)pvVar12 >> 0x20);
          local_54 = *puVar9;
          if ((int)local_54 < (int)local_50) {
            uVar8 = std::__cxx11::string::c_str();
            highsLogUser(in_RDI,kError,
                         "%s matrix packed vector %d has illegal partition end of %d < %d =  start\n"
                         ,uVar8,(ulong)local_58,(ulong)local_54,CONCAT44(uVar13,local_50));
            return kError;
          }
        }
        local_4c = local_50;
      }
      if (iVar2 < (int)local_50) {
        uVar8 = std::__cxx11::string::c_str();
        highsLogUser(in_RDI,kError,
                     "%s matrix packed vector %d has illegal start of %d > %d = number of nonzeros\n"
                     ,uVar8,(ulong)in_ECX,(ulong)local_50,CONCAT44(uVar13,iVar2));
        local_4 = kError;
      }
      else if ((bVar5 == 0) || ((int)local_54 <= iVar2)) {
        local_60 = 0;
        local_64 = 0;
        local_70 = 0.0;
        local_78 = (HighsLogOptions *)0x7ff0000000000000;
        local_7c = 0;
        local_88 = 0.0;
        local_90 = (HighsLogOptions *)0x7ff0000000000000;
        HighsHashTable<int,_void>::HighsHashTable
                  ((HighsHashTable<int,_void> *)
                   CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80));
        for (local_bc = 0; (int)local_bc < (int)in_ECX; local_bc = local_bc + 1) {
          puVar9 = (uint *)std::vector<int,_std::allocator<int>_>::operator[]
                                     (in_R9,(long)(int)local_bc);
          local_c8 = *puVar9;
          pvVar7 = std::vector<int,_std::allocator<int>_>::operator[]
                             (in_R9,(long)(int)(local_bc + 1));
          iVar2 = *pvVar7;
          vVar15 = local_60;
          pvVar7 = std::vector<int,_std::allocator<int>_>::operator[](in_R9,(long)(int)local_bc);
          *pvVar7 = vVar15;
          for (; (int)local_c8 < iVar2; local_c8 = local_c8 + 1) {
            pvVar7 = std::vector<int,_std::allocator<int>_>::operator[]
                               (in_stack_00000010,(long)(int)local_c8);
            uVar13 = (undefined4)((ulong)pvVar12 >> 0x20);
            iVar3 = *pvVar7;
            if (iVar3 < 0) {
              uVar8 = std::__cxx11::string::c_str();
              highsLogUser(in_RDI,kError,
                           "%s matrix packed vector %d, entry %d, is illegal index %d\n",uVar8,
                           (ulong)local_bc,(ulong)local_c8,CONCAT44(uVar13,iVar3));
              local_4 = kError;
              goto LAB_007e40e4;
            }
            if (in_EDX <= iVar3) {
              uVar8 = std::__cxx11::string::c_str();
              highsLogUser(in_RDI,kError,
                           "%s matrix packed vector %d, entry %d, is illegal index %12d >= %d = vector dimension\n"
                           ,uVar8,(ulong)local_bc,(ulong)local_c8,CONCAT44(uVar13,iVar3));
              local_4 = kError;
              in_stack_fffffffffffffe70 = in_EDX;
              goto LAB_007e40e4;
            }
            pVVar10 = HighsHashTable<int,_void>::find
                                (in_stack_fffffffffffffe98,in_stack_fffffffffffffe90);
            uVar13 = (undefined4)((ulong)pvVar12 >> 0x20);
            if (pVVar10 != (ValueType *)0x0) {
              uVar8 = std::__cxx11::string::c_str();
              highsLogUser(in_RDI,kError,
                           "%s matrix packed vector %d, entry %d, is duplicate index %d\n",uVar8,
                           (ulong)local_bc,(ulong)local_c8,CONCAT44(uVar13,iVar3));
              local_4 = kError;
              goto LAB_007e40e4;
            }
            pvVar11 = std::vector<double,_std::allocator<double>_>::operator[]
                                (in_stack_00000018,(long)(int)local_c8);
            if ((double)CONCAT44(in_XMM1_Db,in_XMM1_Da) <= ABS(*pvVar11)) {
              if (local_88 < ABS(*pvVar11)) {
                local_88 = ABS(*pvVar11);
              }
              if (ABS(*pvVar11) <= (double)local_90 && (double)local_90 != ABS(*pvVar11)) {
                local_90 = (HighsLogOptions *)((ulong)*pvVar11 & 0x7fffffffffffffff);
              }
              local_7c = local_7c + 1;
            }
            if (ABS(*pvVar11) <= (double)in_XMM0_Qa) {
              if (local_70 < ABS(*pvVar11)) {
                local_70 = ABS(*pvVar11);
              }
              if (ABS(*pvVar11) <= (double)local_78 && (double)local_78 != ABS(*pvVar11)) {
                local_78 = (HighsLogOptions *)((ulong)*pvVar11 & 0x7fffffffffffffff);
              }
              local_64 = local_64 + 1;
            }
            if ((double)in_XMM0_Qa < ABS(*pvVar11)) {
              HighsHashTable<int,void>::insert<int&>
                        (in_stack_fffffffffffffec8,(int *)in_stack_fffffffffffffec0);
              pvVar7 = std::vector<int,_std::allocator<int>_>::operator[]
                                 (in_stack_00000010,(long)(int)local_c8);
              vVar15 = *pvVar7;
              pvVar7 = std::vector<int,_std::allocator<int>_>::operator[]
                                 (in_stack_00000010,(long)local_60);
              *pvVar7 = vVar15;
              pvVar11 = std::vector<double,_std::allocator<double>_>::operator[]
                                  (in_stack_00000018,(long)(int)local_c8);
              vVar1 = *pvVar11;
              pvVar11 = std::vector<double,_std::allocator<double>_>::operator[]
                                  (in_stack_00000018,(long)local_60);
              *pvVar11 = vVar1;
              local_60 = local_60 + 1;
            }
          }
          HighsHashTable<int,_void>::clear
                    ((HighsHashTable<int,_void> *)
                     CONCAT44(in_stack_fffffffffffffe74,in_stack_fffffffffffffe70));
        }
        local_41 = local_7c != 0;
        if (local_41) {
          pHVar14 = in_RDI;
          uVar8 = std::__cxx11::string::c_str();
          highsLogUser(local_90,SUB84(local_88,0),(char *)CONCAT44(in_XMM1_Db,in_XMM1_Da),pHVar14,5,
                       "%s matrix packed vector contains %d |values| in [%g, %g] greater than %g\n",
                       uVar8,(ulong)local_7c);
        }
        if (local_64 != 0) {
          if (bVar5 != 0) {
            pHVar14 = in_RDI;
            uVar8 = std::__cxx11::string::c_str();
            highsLogUser(local_78,SUB84(local_70,0),in_XMM0_Qa,pHVar14,5,
                         "%s matrix packed partitioned vector contains %d |values| in [%g, %g] less than or equal to %g: ignored\n"
                         ,uVar8,(ulong)local_64);
          }
          local_41 = bVar5 != 0 || local_41;
          bVar4 = 0.0 < local_70;
          if (bVar4) {
            uVar8 = std::__cxx11::string::c_str();
            highsLogUser(local_78,SUB84(local_70,0),in_XMM0_Qa,in_RDI,4,
                         "%s matrix packed vector contains %d |values| in [%g, %g] less than or equal to %g: ignored\n"
                         ,uVar8,(ulong)local_64);
          }
        }
        pvVar7 = std::vector<int,_std::allocator<int>_>::operator[](in_R9,(long)(int)in_ECX);
        *pvVar7 = local_60;
        if (local_41) {
          local_f0 = kError;
        }
        else {
          local_f0 = (HighsStatus)bVar4;
        }
        local_4 = local_f0;
LAB_007e40e4:
        HighsHashTable<int,_void>::~HighsHashTable
                  ((HighsHashTable<int,_void> *)
                   CONCAT44(in_stack_fffffffffffffe74,in_stack_fffffffffffffe70));
      }
      else {
        uVar8 = std::__cxx11::string::c_str();
        highsLogUser(in_RDI,kError,
                     "%s matrix packed vector %d has illegal partition end of %d > %d = number of nonzeros\n"
                     ,uVar8,(ulong)in_ECX,(ulong)local_54,CONCAT44(uVar13,iVar2));
        local_4 = kError;
      }
    }
    else {
      uVar8 = std::__cxx11::string::c_str();
      puVar9 = (uint *)std::vector<int,_std::allocator<int>_>::operator[](in_R9,0);
      highsLogUser(in_RDI,kError,"%s matrix start vector begins with %d rather than 0\n",uVar8,
                   (ulong)*puVar9);
      local_4 = kError;
    }
  }
  return local_4;
}

Assistant:

HighsStatus assessMatrix(
    const HighsLogOptions& log_options, const std::string matrix_name,
    const HighsInt vec_dim, const HighsInt num_vec, const bool partitioned,
    vector<HighsInt>& matrix_start, vector<HighsInt>& matrix_p_end,
    vector<HighsInt>& matrix_index, vector<double>& matrix_value,
    const double small_matrix_value, const double large_matrix_value) {
  if (assessMatrixDimensions(log_options, num_vec, partitioned, matrix_start,
                             matrix_p_end, matrix_index,
                             matrix_value) == HighsStatus::kError) {
    return HighsStatus::kError;
  }

  bool error_found = false;
  bool warning_found = false;

  const HighsInt num_nz = matrix_start[num_vec];
  // Assess the starts
  //
  // Check whether the first start is zero
  if (matrix_start[0]) {
    highsLogUser(log_options, HighsLogType::kError,
                 "%s matrix start vector begins with %" HIGHSINT_FORMAT
                 " rather than 0\n",
                 matrix_name.c_str(), matrix_start[0]);
    return HighsStatus::kError;
  }
  // Set up previous_start for a fictitious previous empty packed vector
  HighsInt previous_start = matrix_start[0];
  // Set up this_start to be the first start in case num_vec = 0
  HighsInt this_start = matrix_start[0];
  HighsInt this_p_end = 0;
  if (partitioned) this_p_end = matrix_p_end[0];
  for (HighsInt ix = 0; ix < num_vec; ix++) {
    this_start = matrix_start[ix];
    bool this_start_too_small = this_start < previous_start;
    if (this_start_too_small) {
      highsLogUser(log_options, HighsLogType::kError,
                   "%s matrix packed vector %" HIGHSINT_FORMAT
                   " has illegal start of %" HIGHSINT_FORMAT
                   " < %" HIGHSINT_FORMAT
                   " = "
                   "previous start\n",
                   matrix_name.c_str(), ix, this_start, previous_start);
      return HighsStatus::kError;
    }
    if (partitioned) {
      this_p_end = matrix_p_end[ix];
      bool this_p_end_too_small = this_p_end < this_start;
      if (this_p_end_too_small) {
        highsLogUser(log_options, HighsLogType::kError,
                     "%s matrix packed vector %" HIGHSINT_FORMAT
                     " has illegal partition end of %" HIGHSINT_FORMAT
                     " < %" HIGHSINT_FORMAT
                     " = "
                     " start\n",
                     matrix_name.c_str(), ix, this_p_end, this_start);
        return HighsStatus::kError;
      }
    }
    previous_start = this_start;
  }
  bool this_start_too_big = this_start > num_nz;
  if (this_start_too_big) {
    highsLogUser(log_options, HighsLogType::kError,
                 "%s matrix packed vector %" HIGHSINT_FORMAT
                 " has illegal start of %" HIGHSINT_FORMAT
                 " > %" HIGHSINT_FORMAT
                 " = "
                 "number of nonzeros\n",
                 matrix_name.c_str(), num_vec, this_start, num_nz);
    return HighsStatus::kError;
  }
  if (partitioned) {
    bool this_p_end_too_big = this_p_end > num_nz;
    if (this_p_end_too_big) {
      highsLogUser(log_options, HighsLogType::kError,
                   "%s matrix packed vector %" HIGHSINT_FORMAT
                   " has illegal partition end of %" HIGHSINT_FORMAT
                   " > %" HIGHSINT_FORMAT
                   " = "
                   "number of nonzeros\n",
                   matrix_name.c_str(), num_vec, this_p_end, num_nz);
      return HighsStatus::kError;
    }
  }
  // Assess the indices and values
  // Count the number of acceptable indices/values
  HighsInt num_new_nz = 0;
  HighsInt num_small_values = 0;
  double max_small_value = 0;
  double min_small_value = kHighsInf;
  HighsInt num_large_values = 0;
  double max_large_value = 0;
  double min_large_value = kHighsInf;
  // Use index_map to identify duplicates.
  HighsHashTable<HighsInt> index_set;

  for (HighsInt ix = 0; ix < num_vec; ix++) {
    HighsInt from_el = matrix_start[ix];
    HighsInt to_el = matrix_start[ix + 1];
    // Account for any index-value pairs removed so far
    matrix_start[ix] = num_new_nz;
    for (HighsInt el = from_el; el < to_el; el++) {
      // Check the index
      HighsInt component = matrix_index[el];
      // Check that the index is non-negative
      bool legal_component = component >= 0;
      if (!legal_component) {
        highsLogUser(log_options, HighsLogType::kError,
                     "%s matrix packed vector %" HIGHSINT_FORMAT
                     ", entry %" HIGHSINT_FORMAT
                     ", is illegal index %" HIGHSINT_FORMAT "\n",
                     matrix_name.c_str(), ix, el, component);
        return HighsStatus::kError;
      }
      // Check that the index does not exceed the vector dimension
      legal_component = component < vec_dim;
      if (!legal_component) {
        highsLogUser(log_options, HighsLogType::kError,
                     "%s matrix packed vector %" HIGHSINT_FORMAT
                     ", entry %" HIGHSINT_FORMAT
                     ", is illegal index "
                     "%12" HIGHSINT_FORMAT " >= %" HIGHSINT_FORMAT
                     " = vector dimension\n",
                     matrix_name.c_str(), ix, el, component, vec_dim);
        return HighsStatus::kError;
      }
      // Check that the index has not already occurred.
      legal_component = index_set.find(component) == nullptr;
      if (!legal_component) {
        highsLogUser(log_options, HighsLogType::kError,
                     "%s matrix packed vector %" HIGHSINT_FORMAT
                     ", entry %" HIGHSINT_FORMAT
                     ", is duplicate index %" HIGHSINT_FORMAT "\n",
                     matrix_name.c_str(), ix, el, component);
        return HighsStatus::kError;
      }
      // Check the value
      double abs_value = fabs(matrix_value[el]);
      // Check that the value is not too large
      bool large_value = abs_value >= large_matrix_value;
      if (large_value) {
        if (max_large_value < abs_value) max_large_value = abs_value;
        if (min_large_value > abs_value) min_large_value = abs_value;
        num_large_values++;
      }
      bool ok_value = abs_value > small_matrix_value;
      if (!ok_value) {
        if (max_small_value < abs_value) max_small_value = abs_value;
        if (min_small_value > abs_value) min_small_value = abs_value;
        num_small_values++;
      }
      if (ok_value) {
        // Record where the index has occurred
        index_set.insert(component);
        // Shift the index and value of the OK entry to the new
        // position in the index and value vectors, and increment
        // the new number of nonzeros
        matrix_index[num_new_nz] = matrix_index[el];
        matrix_value[num_new_nz] = matrix_value[el];
        num_new_nz++;
      }
    }  // Loop from_el; to_el
    index_set.clear();
  }  // Loop 0; num_vec
  if (num_large_values) {
    highsLogUser(log_options, HighsLogType::kError,
                 "%s matrix packed vector contains %" HIGHSINT_FORMAT
                 " |values| in [%g, %g] greater than %g\n",
                 matrix_name.c_str(), num_large_values, min_large_value,
                 max_large_value, large_matrix_value);
    error_found = true;
  }
  if (num_small_values) {
    if (partitioned) {
      // Shouldn't happen with a partitioned row-wise matrix since its
      // values should be OK and the code above doesn't handle p_end
      highsLogUser(
          log_options, HighsLogType::kError,
          "%s matrix packed partitioned vector contains %" HIGHSINT_FORMAT
          " |values| in [%g, %g] less than or equal to %g: ignored\n",
          matrix_name.c_str(), num_small_values, min_small_value,
          max_small_value, small_matrix_value);
      error_found = true;
      assert(num_small_values == 0);
    }
    // If explicit zeros are ignored, then no model information is
    // lost, so only report and return a warning if small nonzeros are
    // ignored
    if (max_small_value > 0) {
      highsLogUser(log_options, HighsLogType::kWarning,
                   "%s matrix packed vector contains %" HIGHSINT_FORMAT
                   " |values| in [%g, %g] "
                   "less than or equal to %g: ignored\n",
                   matrix_name.c_str(), num_small_values, min_small_value,
                   max_small_value, small_matrix_value);
      warning_found = true;
    }
  }
  matrix_start[num_vec] = num_new_nz;
  HighsStatus return_status = HighsStatus::kOk;
  if (error_found)
    return_status = HighsStatus::kError;
  else if (warning_found)
    return_status = HighsStatus::kWarning;
  return return_status;
}